

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void warnfcont(void *ud,char *message,int tocont)

{
  lua_State *L;
  int tocont_local;
  char *message_local;
  void *ud_local;
  
  fprintf(_stderr,"%s",message);
  fflush(_stderr);
  if (tocont == 0) {
    fprintf(_stderr,"%s",anon_var_dwarf_8b4e + 5);
    fflush(_stderr);
    lua_setwarnf((lua_State *)ud,warnfon,ud);
  }
  else {
    lua_setwarnf((lua_State *)ud,warnfcont,ud);
  }
  return;
}

Assistant:

static void warnfcont (void *ud, const char *message, int tocont) {
  lua_State *L = (lua_State *)ud;
  lua_writestringerror("%s", message);  /* write message */
  if (tocont)  /* not the last part? */
    lua_setwarnf(L, warnfcont, L);  /* to be continued */
  else {  /* last part */
    lua_writestringerror("%s", "\n");  /* finish message with end-of-line */
    lua_setwarnf(L, warnfon, L);  /* next call is a new message */
  }
}